

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bst.c
# Opt level: O1

void free_erased(vmd_bst_t *tree,vmd_bst_rev_t *rev)

{
  int iVar1;
  vmd_bst_node_t *pvVar2;
  vmd_bst_node_t *pvVar3;
  void *pvVar4;
  vmd_bst_node_t **ppvVar5;
  long lVar6;
  
  if (rev->erased != (vmd_bst_node_t **)0x0) {
    if (rev->erased_data == (void *)0x0) {
      iVar1 = rev->erased_count;
      pvVar4 = malloc(tree->csize * (long)iVar1);
      rev->erased_data = pvVar4;
      if (0 < (long)iVar1) {
        lVar6 = 0;
        do {
          memcpy((void *)(tree->csize * lVar6 + (long)rev->erased_data),
                 &rev->erased[lVar6]->field_0x21,tree->csize);
          lVar6 = lVar6 + 1;
        } while (lVar6 < rev->erased_count);
      }
    }
    iVar1 = rev->erased_count;
    if (0 < (long)iVar1) {
      lVar6 = 0;
      do {
        pvVar2 = rev->erased[lVar6];
        pvVar3 = tree->free;
        if (pvVar3 == (vmd_bst_node_t *)0x0) {
          pvVar2->child[1] = pvVar2;
          pvVar2->child[0] = pvVar2;
          ppvVar5 = &tree->free;
        }
        else {
          pvVar2->child[0] = pvVar3;
          pvVar2->child[1] = pvVar3->child[1];
          pvVar3->child[1] = pvVar2;
          ppvVar5 = pvVar2->child[1]->child;
        }
        *ppvVar5 = pvVar2;
        lVar6 = lVar6 + 1;
      } while (iVar1 != lVar6);
    }
  }
  return;
}

Assistant:

static void
free_erased(bst_t *tree, bst_rev_t *rev)
{
	int i;
	if (rev->erased == NULL)
		return;

	if (rev->erased_data == NULL) {
		rev->erased_data = malloc(tree->csize * rev->erased_count);
		for (i = 0; i < rev->erased_count; i++)
			memcpy(rev->erased_data + i * tree->csize, rev->erased[i]->data, tree->csize);
	}

	for (i = 0; i < rev->erased_count; i++)
		dlist_insert(&tree->free, rev->erased[i]);
}